

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsing.cpp
# Opt level: O2

void __thiscall wasm::ParseException::dump(ParseException *this,ostream *o)

{
  ostream *poVar1;
  
  Colors::magenta(o);
  std::operator<<(o,"[");
  Colors::red(o);
  std::operator<<(o,"parse exception: ");
  Colors::green(o);
  std::operator<<(o,(string *)this);
  if (this->line != 0xffffffffffffffff) {
    Colors::normal(o);
    poVar1 = std::operator<<(o," (at ");
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    poVar1 = std::operator<<(poVar1,":");
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::operator<<(poVar1,")");
  }
  Colors::magenta(o);
  std::operator<<(o,"]");
  Colors::normal(o);
  return;
}

Assistant:

void ParseException::dump(std::ostream& o) const {
  Colors::magenta(o);
  o << "[";
  Colors::red(o);
  o << "parse exception: ";
  Colors::green(o);
  o << text;
  if (line != size_t(-1)) {
    Colors::normal(o);
    o << " (at " << line << ":" << col << ")";
  }
  Colors::magenta(o);
  o << "]";
  Colors::normal(o);
}